

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void free_ZNode(Parser *p,ZNode *z,SNode *s)

{
  SNode *pSVar1;
  uint32 uVar2;
  uint local_24;
  uint i;
  SNode *s_local;
  ZNode *z_local;
  Parser *p_local;
  
  uVar2 = z->pn->refcount - 1;
  z->pn->refcount = uVar2;
  if (uVar2 == 0) {
    free_PNode(p,z->pn);
  }
  for (local_24 = 0; local_24 < (z->sns).n; local_24 = local_24 + 1) {
    if ((s != (z->sns).v[local_24]) &&
       (pSVar1 = (z->sns).v[local_24], uVar2 = pSVar1->refcount - 1, pSVar1->refcount = uVar2,
       uVar2 == 0)) {
      free_SNode(p,(z->sns).v[local_24]);
    }
  }
  if (((z->sns).v != (SNode **)0x0) && ((z->sns).v != (z->sns).e)) {
    free((z->sns).v);
  }
  (z->sns).n = 0;
  (z->sns).v = (SNode **)0x0;
  free(z);
  return;
}

Assistant:

static void free_ZNode(Parser *p, ZNode *z, SNode *s) {
  uint i;
  unref_pn(p, z->pn);
  for (i = 0; i < z->sns.n; i++)
    if (s != z->sns.v[i]) unref_sn(p, z->sns.v[i]);
  vec_free(&z->sns);
#ifdef USE_FREELISTS
  znode_next(z) = p->free_znodes;
  p->free_znodes = z;
#else
  FREE(z);
#endif
}